

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

MatrixXd * Util::LoadDatFile(MatrixXd *__return_storage_ptr__,string *file,int rows,int cols)

{
  char cVar1;
  runtime_error *this;
  ulong uVar2;
  int colidx;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  string line;
  size_type sz;
  string word;
  ifstream myFile;
  stringstream ss;
  
  _myFile = (long)rows;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&myFile);
  std::ifstream::ifstream(&myFile,(string *)file,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    word._M_dataplus._M_p = (pointer)&word.field_2;
    word._M_string_length = 0;
    uVar5 = 0;
    uVar4 = (ulong)(uint)cols;
    if (cols < 1) {
      uVar4 = uVar5;
    }
    line.field_2._M_local_buf[0] = '\0';
    uVar2 = (ulong)(uint)rows;
    if (rows < 1) {
      uVar2 = uVar5;
    }
    word.field_2._M_local_buf[0] = '\0';
    for (; uVar5 != uVar2; uVar5 = uVar5 + 1) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&myFile,(string *)&line);
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
      for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&ss,(string *)&word,',');
        dVar6 = std::__cxx11::stod(&word,&sz);
        (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
        m_storage.m_data
        [(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
         m_storage.m_rows * uVar3 + uVar5] = dVar6;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    std::__cxx11::string::~string((string *)&word);
    std::__cxx11::string::~string((string *)&line);
    std::ifstream::~ifstream(&myFile);
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Could not open file");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Eigen::MatrixXd LoadDatFile(std::string file, int rows, int cols){

		//initialize the matrix
		Eigen::MatrixXd dat = Eigen::MatrixXd::Zero(rows, cols);

		//create input filestream
		std::ifstream myFile(file);

		// Make sure the file is open
		if(!myFile.is_open()) throw std::runtime_error("Could not open file");

		//line and word string
		std::string line;
		std::string word;
		std::string::size_type sz;     // alias of size_t

		// cycle
	    for (int rowidx = 0; rowidx < rows; ++rowidx) {

	    	//get line and create string stream
	    	std::getline(myFile, line);
	    	std::stringstream ss(line);
	    	
	    	for (int colidx = 0; colidx < cols; ++colidx) {

	    		//extract
	    		std::getline(ss, word, ',');

	    		dat(rowidx,colidx) = std::stod(word, &sz);
	    		
	    	}
	    }

	    //output
	    return dat;


	}